

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,char *rawPixelData,DeepFrameBuffer *frameBuffer,int scanLine1
          ,int scanLine2)

{
  ulong uVar1;
  Compression *pCVar2;
  Slice *pSVar3;
  Data *pDVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  long lVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  ulong maxScanLineSize;
  long lVar13;
  int accumulatedCount;
  Compressor *local_1e0;
  long local_1d8;
  long local_1d0;
  char *local_1c8;
  long local_1c0;
  char *readPtr;
  ostream local_1a8 [376];
  
  iVar9 = *(int *)rawPixelData;
  pDVar4 = this->_data;
  iVar10 = iVar9 + pDVar4->linesInBuffer + -1;
  if (pDVar4->maxY < iVar10) {
    iVar10 = pDVar4->maxY;
  }
  if (iVar9 == scanLine1) {
    if (iVar10 == scanLine2) {
      uVar1 = *(ulong *)(rawPixelData + 4);
      maxScanLineSize =
           (ulong)(((scanLine2 - scanLine1) * 4 + 4) * ((pDVar4->maxX - pDVar4->minX) + 1));
      if (uVar1 < maxScanLineSize) {
        pCVar2 = Header::compression(&pDVar4->header);
        local_1e0 = newCompressor(*pCVar2,maxScanLineSize,&this->_data->header);
        (*local_1e0->_vptr_Compressor[6])
                  (local_1e0,rawPixelData + 0x1c,uVar1 & 0xffffffff,(ulong)(uint)scanLine1,&readPtr)
        ;
      }
      else {
        readPtr = rawPixelData + 0x1c;
        local_1e0 = (Compressor *)0x0;
      }
      pSVar3 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      pcVar8 = pSVar3->base;
      pSVar3 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      lVar12 = (long)(int)pSVar3->xStride;
      pSVar3 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      local_1d8 = (long)(int)pSVar3->yStride;
      lVar7 = (long)scanLine1;
      local_1d0 = (long)scanLine2;
      pcVar8 = pcVar8 + lVar7 * local_1d8;
      while (lVar7 <= local_1d0) {
        pDVar4 = this->_data;
        lVar13 = (long)pDVar4->minX;
        piVar11 = (int *)(pcVar8 + lVar12 * lVar13);
        iVar9 = 0;
        local_1c8 = pcVar8;
        local_1c0 = lVar7;
        for (; lVar13 <= pDVar4->maxX; lVar13 = lVar13 + 1) {
          Xdr::read<Imf_3_2::CharPtrIO,char_const*>(&readPtr,&accumulatedCount);
          pDVar4 = this->_data;
          if ((int)lVar13 == pDVar4->minX) {
            iVar9 = 0;
          }
          *piVar11 = accumulatedCount - iVar9;
          piVar11 = (int *)((long)piVar11 + lVar12);
          iVar9 = accumulatedCount;
        }
        pcVar8 = local_1c8 + local_1d8;
        lVar7 = local_1c0 + 1;
      }
      if (local_1e0 != (Compressor *)0x0) {
        (*local_1e0->_vptr_Compressor[1])();
      }
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&readPtr);
    poVar5 = std::operator<<(local_1a8,"readPixelSampleCounts(rawPixelData,frameBuffer,");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,scanLine1);
    poVar5 = std::operator<<(poVar5,',');
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,scanLine2);
    poVar5 = std::operator<<(poVar5,") called with incorrect end scanline - should be ");
    std::ostream::operator<<((ostream *)poVar5,iVar10);
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar6,(stringstream *)&readPtr);
    __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&readPtr);
  poVar5 = std::operator<<(local_1a8,"readPixelSampleCounts(rawPixelData,frameBuffer,");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,scanLine1);
  poVar5 = std::operator<<(poVar5,',');
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,scanLine2);
  poVar5 = std::operator<<(poVar5,") called with incorrect start scanline - should be ");
  std::ostream::operator<<((ostream *)poVar5,iVar9);
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar6,(stringstream *)&readPtr);
  __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (
    const char*            rawPixelData,
    const DeepFrameBuffer& frameBuffer,
    int                    scanLine1,
    int                    scanLine2) const
{
    //
    // read header from block - already converted from Xdr to native format
    //
    int      data_scanline            = *(int*) rawPixelData;
    uint64_t sampleCountTableDataSize = *(uint64_t*) (rawPixelData + 4);

    int maxY;
    maxY = min (data_scanline + _data->linesInBuffer - 1, _data->maxY);

    if (scanLine1 != data_scanline)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "readPixelSampleCounts(rawPixelData,frameBuffer,"
                << scanLine1 << ',' << scanLine2
                << ") called with incorrect start scanline - should be "
                << data_scanline);
    }

    if (scanLine2 != maxY)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "readPixelSampleCounts(rawPixelData,frameBuffer,"
                << scanLine1 << ',' << scanLine2
                << ") called with incorrect end scanline - should be " << maxY);
    }

    //
    // If the sample count table is compressed, we'll uncompress it.
    //

    uint64_t rawSampleCountTableSize = (maxY - data_scanline + 1) *
                                       (_data->maxX - _data->minX + 1) *
                                       Xdr::size<unsigned int> ();

    Compressor* decomp = NULL;
    const char* readPtr;
    if (sampleCountTableDataSize < rawSampleCountTableSize)
    {
        decomp = newCompressor (
            _data->header.compression (),
            rawSampleCountTableSize,
            _data->header);

        decomp->uncompress (
            rawPixelData + 28,
            static_cast<int> (sampleCountTableDataSize),
            data_scanline,
            readPtr);
    }
    else
        readPtr = rawPixelData + 28;

    char* base  = frameBuffer.getSampleCountSlice ().base;
    int xStride = static_cast<int> (frameBuffer.getSampleCountSlice ().xStride);
    int yStride = static_cast<int> (frameBuffer.getSampleCountSlice ().yStride);

    for (int y = scanLine1; y <= scanLine2; y++)
    {
        int lastAccumulatedCount = 0;
        for (int x = _data->minX; x <= _data->maxX; x++)
        {
            int accumulatedCount, count;

            //
            // Read the sample count for pixel (x, y).
            //

            Xdr::read<CharPtrIO> (readPtr, accumulatedCount);
            if (x == _data->minX)
                count = accumulatedCount;
            else
                count = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;

            //
            // Store the data in both internal and external data structure.
            //

            sampleCount (base, xStride, yStride, x, y) = count;
        }
    }

    if (decomp) { delete decomp; }
}